

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Vector<Converter::Impl::RawDeclarationVariable> * __thiscall
dxil_spv::Converter::Impl::create_raw_ssbo_variable_alias_group
          (Vector<Converter::Impl::RawDeclarationVariable> *__return_storage_ptr__,Impl *this,
          Vector<RawDeclaration> *raw_decls,uint32_t range_size,String *name)

{
  bool bVar1;
  size_type __n;
  value_type local_68;
  reference local_58;
  RawDeclaration *decl;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<RawDeclaration> *__range1;
  String *name_local;
  uint32_t range_size_local;
  Vector<RawDeclaration> *raw_decls_local;
  Impl *this_local;
  Vector<RawDeclarationVariable> *group;
  
  std::
  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ::vector(__return_storage_ptr__);
  __n = std::
        vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
        ::size(raw_decls);
  std::
  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ::reserve(__return_storage_ptr__,__n);
  __end1 = std::
           vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
           ::begin(raw_decls);
  decl = (RawDeclaration *)
         std::
         vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
         ::end(raw_decls);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_dxil_spv::Converter::Impl::RawDeclaration_*,_std::vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>_>
                                     *)&decl), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_dxil_spv::Converter::Impl::RawDeclaration_*,_std::vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>_>
               ::operator*(&__end1);
    local_68.declaration.type = local_58->type;
    local_68.declaration.width = local_58->width;
    local_68.declaration.vecsize = local_58->vecsize;
    local_68.var_id = create_raw_ssbo_variable(this,local_58,range_size,name);
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::push_back(__return_storage_ptr__,&local_68);
    __gnu_cxx::
    __normal_iterator<const_dxil_spv::Converter::Impl::RawDeclaration_*,_std::vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Converter::Impl::RawDeclarationVariable> Converter::Impl::create_raw_ssbo_variable_alias_group(
		const Vector<RawDeclaration> &raw_decls,
		uint32_t range_size, const String &name)
{
	Vector<RawDeclarationVariable> group;
	group.reserve(raw_decls.size());
	for (auto &decl : raw_decls)
		group.push_back({ decl, create_raw_ssbo_variable(decl, range_size, name) });
	return group;
}